

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

void capnp::_::anon_unknown_129::dynamicCheckTestMessage<capnp::DynamicStruct::Reader>
               (Reader reader)

{
  double dVar1;
  char *pcVar2;
  double dVar3;
  ulong uVar4;
  ReaderFor<bool> RVar5;
  int8_t iVar6;
  uint8_t uVar7;
  int16_t iVar8;
  uint16_t uVar9;
  int32_t iVar10;
  uint32_t uVar11;
  int iVar12;
  int64_t iVar13;
  uchar *puVar14;
  uint64_t uVar15;
  size_type sVar16;
  ulong uVar17;
  bool bVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  uint extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar20;
  double dVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  float fVar24;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StringPtr name_09;
  StringPtr name_10;
  StringPtr name_11;
  StringPtr name_12;
  StringPtr name_13;
  StringPtr name_14;
  StringPtr name_15;
  StringPtr name_16;
  StringPtr name_17;
  StringPtr name_18;
  StringPtr name_19;
  StringPtr name_20;
  StringPtr name_21;
  StringPtr name_22;
  StringPtr name_23;
  StringPtr name_24;
  StringPtr name_25;
  StringPtr name_26;
  StringPtr name_27;
  StringPtr name_28;
  StringPtr name_29;
  StringPtr name_30;
  StringPtr name_31;
  StringPtr name_32;
  StringPtr name_33;
  StringPtr name_34;
  StringPtr name_35;
  StringPtr name_36;
  StringPtr name_37;
  StringPtr name_38;
  StringPtr name_39;
  StringPtr name_40;
  StringPtr name_41;
  StringPtr name_42;
  StringPtr name_43;
  StringPtr name_44;
  StringPtr name_45;
  StringPtr name_46;
  StringPtr name_47;
  StringPtr name_48;
  StringPtr name_49;
  StringPtr name_50;
  StringPtr name_51;
  StringPtr name_52;
  StringPtr name_53;
  StringPtr name_54;
  StringPtr name_55;
  StringPtr name_56;
  StringPtr name_57;
  StringPtr name_58;
  StringPtr name_59;
  StringPtr name_60;
  StringPtr name_61;
  StringPtr name_62;
  StringPtr name_63;
  initializer_list<capnp::Void> expected;
  StringPtr name_64;
  initializer_list<bool> expected_00;
  StringPtr name_65;
  initializer_list<signed_char> expected_01;
  StringPtr name_66;
  initializer_list<short> expected_02;
  StringPtr name_67;
  initializer_list<int> expected_03;
  StringPtr name_68;
  initializer_list<long> expected_04;
  StringPtr name_69;
  initializer_list<unsigned_char> expected_05;
  StringPtr name_70;
  initializer_list<unsigned_short> expected_06;
  StringPtr name_71;
  initializer_list<unsigned_int> expected_07;
  StringPtr name_72;
  initializer_list<unsigned_long> expected_08;
  StringPtr name_73;
  initializer_list<float> expected_09;
  StringPtr name_74;
  initializer_list<double> expected_10;
  StringPtr name_75;
  initializer_list<capnp::Text::Reader> expected_11;
  StringPtr name_76;
  initializer_list<capnp::Data::Reader> expected_12;
  StringPtr name_77;
  StringPtr name_78;
  StringPtr name_79;
  StringPtr name_80;
  StringPtr name_81;
  StringPtr name_82;
  StringPtr name_83;
  StringPtr name_84;
  initializer_list<const_char_*> expected_13;
  StringPtr name_85;
  StringPtr name_86;
  StringPtr name_87;
  StringPtr name_88;
  StringPtr name_89;
  initializer_list<bool> expected_14;
  StringPtr name_90;
  initializer_list<signed_char> expected_15;
  StringPtr name_91;
  initializer_list<short> expected_16;
  StringPtr name_92;
  initializer_list<int> expected_17;
  StringPtr name_93;
  initializer_list<long> expected_18;
  StringPtr name_94;
  initializer_list<unsigned_char> expected_19;
  StringPtr name_95;
  initializer_list<unsigned_short> expected_20;
  StringPtr name_96;
  initializer_list<unsigned_int> expected_21;
  StringPtr name_97;
  initializer_list<unsigned_long> expected_22;
  StringPtr name_98;
  StringPtr name_99;
  StringPtr name_x00100;
  initializer_list<capnp::Text::Reader> expected_23;
  StringPtr name_x00101;
  initializer_list<capnp::Data::Reader> expected_24;
  StringPtr name_x00102;
  StringPtr name_x00103;
  StringPtr name_x00104;
  StringPtr name_x00105;
  StringPtr name_x00106;
  StringPtr name_x00107;
  StringPtr name_x00108;
  StringPtr name_x00109;
  initializer_list<const_char_*> expected_25;
  ReaderFor<Text> RVar25;
  Reader RVar26;
  Reader RVar27;
  Fault f;
  ReaderFor<capnp::DynamicList> listReader_1;
  ReaderFor<capnp::DynamicStruct> subReader;
  ReaderFor<capnp::DynamicStruct> subSubReader;
  Fault local_948;
  char *pcStack_940;
  char *local_938;
  undefined8 uStack_930;
  char *local_928;
  undefined8 uStack_920;
  undefined1 in_stack_fffffffffffff6f0 [16];
  Reader local_900;
  undefined1 local_8b8 [16];
  ReaderFor<DynamicStruct> local_8a0;
  ReaderFor<DynamicList> local_868;
  undefined1 local_828 [16];
  ArrayPtr<const_char> local_810;
  ArrayPtr<const_char> local_7d8;
  Reader local_7c8;
  Reader local_780;
  Reader local_738;
  Reader local_6f0;
  Reader local_6a8;
  Reader local_660;
  Reader local_618;
  Reader local_5d0;
  Reader local_588;
  Reader local_540;
  Reader local_4f8;
  Reader local_4b0;
  Reader local_468;
  Reader local_420;
  Reader local_3d8;
  Reader local_390;
  Reader local_348;
  Reader local_300;
  Reader local_2b8;
  Reader local_270;
  Reader local_228;
  Reader local_1e0;
  Reader local_198;
  Reader local_150;
  Reader local_108;
  Reader local_c0;
  Reader local_78;
  
  name.content.size_ = 10;
  name.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  name_00.content.size_ = 10;
  name_00.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_00);
  RVar5 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (!RVar5 && kj::_::Debug::minSeverity < 3) {
    local_900.type._0_1_ = 1;
    name_01.content.size_ = 10;
    name_01.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_01);
    local_868.schema.elementType.baseType._0_1_ =
         DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[73],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x153,ERROR,
               "\"failed: expected \" \"(true) == (reader.get(\\\"boolField\\\").template as<bool>())\", true, reader.get(\"boolField\").template as<bool>()"
               ,(char (*) [73])
                "failed: expected (true) == (reader.get(\"boolField\").template as<bool>())",
               (bool *)&local_900,(bool *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_02.content.size_ = 10;
  name_02.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_02);
  iVar6 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar6 != -0x7b) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xffffff85;
    name_03.content.size_ = 10;
    name_03.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_03);
    iVar6 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType._0_1_ = iVar6;
    kj::_::Debug::log<char_const(&)[75],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x154,ERROR,
               "\"failed: expected \" \"(-123) == (reader.get(\\\"int8Field\\\").template as<int8_t>())\", -123, reader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [75])
                "failed: expected (-123) == (reader.get(\"int8Field\").template as<int8_t>())",
               (int *)&local_900,(char *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_04.content.size_ = 0xb;
  name_04.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_04);
  iVar8 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar8 != -0x3039) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xffffcfc7;
    name_05.content.size_ = 0xb;
    name_05.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_05);
    iVar8 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType = iVar8;
    kj::_::Debug::log<char_const(&)[79],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x155,ERROR,
               "\"failed: expected \" \"(-12345) == (reader.get(\\\"int16Field\\\").template as<int16_t>())\", -12345, reader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [79])
                "failed: expected (-12345) == (reader.get(\"int16Field\").template as<int16_t>())",
               (int *)&local_900,(short *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_06.content.size_ = 0xb;
  name_06.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_06);
  iVar10 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar10 != -0xbc614e) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xff439eb2;
    name_07.content.size_ = 0xb;
    name_07.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_07);
    iVar10 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType = (short)iVar10;
    local_868.schema.elementType.listDepth = (char)((uint)iVar10 >> 0x10);
    local_868.schema.elementType.isImplicitParam = (bool)(char)((uint)iVar10 >> 0x18);
    kj::_::Debug::log<char_const(&)[82],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x156,ERROR,
               "\"failed: expected \" \"(-12345678) == (reader.get(\\\"int32Field\\\").template as<int32_t>())\", -12345678, reader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [82])
                "failed: expected (-12345678) == (reader.get(\"int32Field\").template as<int32_t>())"
               ,(int *)&local_900,(int *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_08.content.size_ = 0xb;
  name_08.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_08);
  iVar13 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar13 != -0x7048860ddf79) && (kj::_::Debug::minSeverity < 3)) {
    local_900._0_8_ = (char *)0xffff8fb779f22087;
    name_09.content.size_ = 0xb;
    name_09.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_09);
    puVar14 = (uchar *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
    local_868.schema.elementType._0_8_ = puVar14;
    kj::_::Debug::log<char_const(&)[91],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x157,ERROR,
               "\"failed: expected \" \"(-123456789012345ll) == (reader.get(\\\"int64Field\\\").template as<int64_t>())\", -123456789012345ll, reader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [91])
                "failed: expected (-123456789012345ll) == (reader.get(\"int64Field\").template as<int64_t>())"
               ,(longlong *)&local_900,(long *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_10.content.size_ = 0xb;
  name_10.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_10);
  uVar7 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar7 != 0xea) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xea;
    name_11.content.size_ = 0xb;
    name_11.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_11);
    uVar7 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&local_948)
    ;
    local_868.schema.elementType.baseType._0_1_ = uVar7;
    kj::_::Debug::log<char_const(&)[77],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x158,ERROR,
               "\"failed: expected \" \"(234u) == (reader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 234u, reader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [77])
                "failed: expected (234u) == (reader.get(\"uInt8Field\").template as<uint8_t>())",
               (uint *)&local_900,(uchar *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_12.content.size_ = 0xc;
  name_12.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_12);
  uVar9 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar9 != 0xb26e) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xb26e;
    name_13.content.size_ = 0xc;
    name_13.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_13);
    uVar9 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Reader *)&local_948);
    local_868.schema.elementType.baseType = uVar9;
    kj::_::Debug::log<char_const(&)[81],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x159,ERROR,
               "\"failed: expected \" \"(45678u) == (reader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 45678u, reader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [81])
                "failed: expected (45678u) == (reader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(uint *)&local_900,(unsigned_short *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_14.content.size_ = 0xc;
  name_14.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_14);
  uVar11 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar11 != 0xce0a6a14) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xce0a6a14;
    name_15.content.size_ = 0xc;
    name_15.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_15);
    uVar11 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&local_948)
    ;
    local_868.schema.elementType.baseType = (short)uVar11;
    local_868.schema.elementType.listDepth = (char)(uVar11 >> 0x10);
    local_868.schema.elementType.isImplicitParam = (bool)(char)(uVar11 >> 0x18);
    kj::_::Debug::log<char_const(&)[86],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15a,ERROR,
               "\"failed: expected \" \"(3456789012u) == (reader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 3456789012u, reader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [86])
                "failed: expected (3456789012u) == (reader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(uint *)&local_900,(uint *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_16.content.size_ = 0xc;
  name_16.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_16);
  uVar15 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar15 != 0xab54a98ceb1f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    local_900._0_8_ = (char *)0xab54a98ceb1f0ad2;
    name_17.content.size_ = 0xc;
    name_17.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_17);
    puVar14 = (uchar *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
    local_868.schema.elementType._0_8_ = puVar14;
    kj::_::Debug::log<char_const(&)[98],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x15b,ERROR,
               "\"failed: expected \" \"(12345678901234567890ull) == (reader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 12345678901234567890ull, reader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [98])
                "failed: expected (12345678901234567890ull) == (reader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(unsigned_long_long *)&local_900,(unsigned_long *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_18.content.size_ = 0xd;
  name_18.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_18);
  fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
  if ((fVar19 != 1234.5) || (NAN(fVar19))) {
    fVar20 = fVar19 + -1234.5;
    fVar24 = -fVar20;
    if (-fVar20 <= fVar20) {
      fVar24 = fVar20;
    }
    fVar20 = -fVar19;
    if (-fVar19 <= fVar19) {
      fVar20 = fVar19;
    }
    local_8b8._0_8_ = (double)fVar24;
    local_828._0_8_ = (double)(fVar20 + 1234.5) * 1e-05;
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (((double)local_828._0_8_ <= (double)local_8b8._0_8_) && (kj::_::Debug::minSeverity < 3)) {
      name_19.content.size_ = 0xd;
      name_19.content.ptr = "float32Field";
      DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_19);
      fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
      local_900.type = (Type)fVar19;
      local_868.schema.elementType.baseType = 0x5000;
      local_868.schema.elementType.listDepth = 0x9a;
      local_868.schema.elementType.isImplicitParam = true;
      kj::_::Debug::log<char_const(&)[101],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(reader.get(\\\"float32Field\\\").template as<float>(), 1234.5f)\", reader.get(\"float32Field\").template as<float>(), 1234.5f"
                 ,(char (*) [101])
                  "failed: expected ::kj::_::floatAlmostEqual(reader.get(\"float32Field\").template as<float>(), 1234.5f)"
                 ,(float *)&local_900,(float *)&local_868);
      goto LAB_00246003;
    }
  }
  else {
LAB_00246003:
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_20.content.size_ = 0xd;
  name_20.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_20);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
  if ((dVar1 != -1.23e+47) || (NAN(dVar1))) {
    dVar3 = dVar1 + 1.23e+47;
    dVar21 = -dVar3;
    if (-dVar3 <= dVar3) {
      dVar21 = dVar3;
    }
    local_8b8._8_4_ = extraout_XMM0_Dc;
    local_8b8._0_8_ = dVar21;
    local_8b8._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    uVar22 = (undefined4)((ulong)-dVar1 >> 0x20);
    if (-dVar1 <= dVar1) {
      uVar22 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_828._8_4_ = extraout_XMM0_Dc;
    local_828._0_8_ = ((double)CONCAT44(uVar22,SUB84(dVar1,0)) + 1.23e+47) * 1e-12;
    local_828._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (((double)local_828._0_8_ <= (double)local_8b8._0_8_) && (kj::_::Debug::minSeverity < 3)) {
      name_21.content.size_ = 0xd;
      name_21.content.ptr = "float64Field";
      DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_21);
      pcVar2 = (char *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
      local_900._0_8_ = pcVar2;
      local_868.schema.elementType._0_8_ = (uchar *)0xc9b58b82c0e0bb00;
      kj::_::Debug::log<char_const(&)[103],double,double>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(reader.get(\\\"float64Field\\\").template as<double>(), -123e45)\", reader.get(\"float64Field\").template as<double>(), -123e45"
                 ,(char (*) [103])
                  "failed: expected ::kj::_::doubleAlmostEqual(reader.get(\"float64Field\").template as<double>(), -123e45)"
                 ,(double *)&local_900,(double *)&local_868);
      goto LAB_0024611b;
    }
  }
  else {
LAB_0024611b:
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_22.content.size_ = 10;
  name_22.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_22);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  if (RVar25.super_StringPtr.content.size_ == 4) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"foo",3);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (iVar12 != 0) goto joined_r0x0024618d;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
joined_r0x0024618d:
    if (kj::_::Debug::minSeverity < 3) {
      name_23.content.size_ = 10;
      name_23.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_23);
      local_900._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
      kj::_::Debug::log<char_const(&)[74],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15e,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.get(\\\"textField\\\").template as<Text>())\", \"foo\", reader.get(\"textField\").template as<Text>()"
                 ,(char (*) [74])
                  "failed: expected (\"foo\") == (reader.get(\"textField\").template as<Text>())",
                 (char (*) [4])"foo",(Reader *)&local_900);
      DynamicValue::Reader::~Reader((Reader *)&local_948);
    }
  }
  name_24.content.size_ = 10;
  name_24.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_24);
  RVar26 = DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&local_948);
  if (RVar26.super_ArrayPtr<const_unsigned_char>.size_ == 3) {
    if (*RVar26.super_ArrayPtr<const_unsigned_char>.ptr == 'b') {
      uVar4 = 0;
      do {
        uVar17 = uVar4;
        if (uVar17 == 2) break;
        uVar4 = uVar17 + 1;
      } while ("\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar"[uVar17 + 0x32] ==
               RVar26.super_ArrayPtr<const_unsigned_char>.ptr[uVar17 + 1]);
      bVar18 = 1 < uVar17;
    }
    else {
      bVar18 = false;
    }
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (!bVar18) goto LAB_00246274;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
LAB_00246274:
    if (kj::_::Debug::minSeverity < 3) {
      local_900.field_1.intValue = 3;
      local_900._0_8_ = "bar";
      name_25.content.size_ = 10;
      name_25.content.ptr = "dataField";
      DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_25);
      local_868.schema.elementType =
           (Type)DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                           ((Reader *)&local_948);
      kj::_::Debug::log<char_const(&)[80],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x15f,ERROR,
                 "\"failed: expected \" \"(data(\\\"bar\\\")) == (reader.get(\\\"dataField\\\").template as<Data>())\", data(\"bar\"), reader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [80])
                  "failed: expected (data(\"bar\")) == (reader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_900,(Reader *)&local_868);
      DynamicValue::Reader::~Reader((Reader *)&local_948);
    }
  }
  name_26.content.size_ = 0xc;
  name_26.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_26);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            (&local_8a0,(Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  name_27.content.size_ = 10;
  name_27.content.ptr = "voidField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_27);
  DynamicValue::Reader::AsImpl<capnp::Void,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  name_28.content.size_ = 10;
  name_28.content.ptr = "boolField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_28);
  RVar5 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (!RVar5 && kj::_::Debug::minSeverity < 3) {
    local_900.type._0_1_ = 1;
    name_29.content.size_ = 10;
    name_29.content.ptr = "boolField";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_29);
    RVar5 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType._0_1_ = RVar5;
    kj::_::Debug::log<char_const(&)[76],bool,bool>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x163,ERROR,
               "\"failed: expected \" \"(true) == (subReader.get(\\\"boolField\\\").template as<bool>())\", true, subReader.get(\"boolField\").template as<bool>()"
               ,(char (*) [76])
                "failed: expected (true) == (subReader.get(\"boolField\").template as<bool>())",
               (bool *)&local_900,(bool *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_30.content.size_ = 10;
  name_30.content.ptr = "int8Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_30);
  iVar6 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar6 != -0xc) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xfffffff4;
    name_31.content.size_ = 10;
    name_31.content.ptr = "int8Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_31);
    iVar6 = DynamicValue::Reader::AsImpl<signed_char,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType._0_1_ = iVar6;
    kj::_::Debug::log<char_const(&)[77],int,signed_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x164,ERROR,
               "\"failed: expected \" \"(-12) == (subReader.get(\\\"int8Field\\\").template as<int8_t>())\", -12, subReader.get(\"int8Field\").template as<int8_t>()"
               ,(char (*) [77])
                "failed: expected (-12) == (subReader.get(\"int8Field\").template as<int8_t>())",
               (int *)&local_900,(char *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_32.content.size_ = 0xb;
  name_32.content.ptr = "int16Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_32);
  iVar8 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar8 != 0xd80) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xd80;
    name_33.content.size_ = 0xb;
    name_33.content.ptr = "int16Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_33);
    iVar8 = DynamicValue::Reader::AsImpl<short,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType = iVar8;
    kj::_::Debug::log<char_const(&)[80],int,short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x165,ERROR,
               "\"failed: expected \" \"(3456) == (subReader.get(\\\"int16Field\\\").template as<int16_t>())\", 3456, subReader.get(\"int16Field\").template as<int16_t>()"
               ,(char (*) [80])
                "failed: expected (3456) == (subReader.get(\"int16Field\").template as<int16_t>())",
               (int *)&local_900,(short *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_34.content.size_ = 0xb;
  name_34.content.ptr = "int32Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_34);
  iVar10 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar10 != -0x4b3eff2) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0xfb4c100e;
    name_35.content.size_ = 0xb;
    name_35.content.ptr = "int32Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_35);
    iVar10 = DynamicValue::Reader::AsImpl<int,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_868.schema.elementType.baseType = (short)iVar10;
    local_868.schema.elementType.listDepth = (char)((uint)iVar10 >> 0x10);
    local_868.schema.elementType.isImplicitParam = (bool)(char)((uint)iVar10 >> 0x18);
    kj::_::Debug::log<char_const(&)[85],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x166,ERROR,
               "\"failed: expected \" \"(-78901234) == (subReader.get(\\\"int32Field\\\").template as<int32_t>())\", -78901234, subReader.get(\"int32Field\").template as<int32_t>()"
               ,(char (*) [85])
                "failed: expected (-78901234) == (subReader.get(\"int32Field\").template as<int32_t>())"
               ,(int *)&local_900,(int *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_36.content.size_ = 0xb;
  name_36.content.ptr = "int64Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_36);
  iVar13 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((iVar13 != 0x33a638e8734e) && (kj::_::Debug::minSeverity < 3)) {
    local_900._0_8_ = (char *)0x33a638e8734e;
    name_37.content.size_ = 0xb;
    name_37.content.ptr = "int64Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_37);
    puVar14 = (uchar *)DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
    local_868.schema.elementType._0_8_ = puVar14;
    kj::_::Debug::log<char_const(&)[92],long_long,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x167,ERROR,
               "\"failed: expected \" \"(56789012345678ll) == (subReader.get(\\\"int64Field\\\").template as<int64_t>())\", 56789012345678ll, subReader.get(\"int64Field\").template as<int64_t>()"
               ,(char (*) [92])
                "failed: expected (56789012345678ll) == (subReader.get(\"int64Field\").template as<int64_t>())"
               ,(longlong *)&local_900,(long *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_38.content.size_ = 0xb;
  name_38.content.ptr = "uInt8Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_38);
  uVar7 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar7 != 'Z') && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0x5a;
    name_39.content.size_ = 0xb;
    name_39.content.ptr = "uInt8Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_39);
    uVar7 = DynamicValue::Reader::AsImpl<unsigned_char,_(capnp::Kind)0>::apply((Reader *)&local_948)
    ;
    local_868.schema.elementType.baseType._0_1_ = uVar7;
    kj::_::Debug::log<char_const(&)[79],unsigned_int,unsigned_char>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x168,ERROR,
               "\"failed: expected \" \"(90u) == (subReader.get(\\\"uInt8Field\\\").template as<uint8_t>())\", 90u, subReader.get(\"uInt8Field\").template as<uint8_t>()"
               ,(char (*) [79])
                "failed: expected (90u) == (subReader.get(\"uInt8Field\").template as<uint8_t>())",
               (uint *)&local_900,(uchar *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_40.content.size_ = 0xc;
  name_40.content.ptr = "uInt16Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_40);
  uVar9 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar9 != 0x4d2) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0x4d2;
    name_41.content.size_ = 0xc;
    name_41.content.ptr = "uInt16Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_41);
    uVar9 = DynamicValue::Reader::AsImpl<unsigned_short,_(capnp::Kind)0>::apply
                      ((Reader *)&local_948);
    local_868.schema.elementType.baseType = uVar9;
    kj::_::Debug::log<char_const(&)[83],unsigned_int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x169,ERROR,
               "\"failed: expected \" \"(1234u) == (subReader.get(\\\"uInt16Field\\\").template as<uint16_t>())\", 1234u, subReader.get(\"uInt16Field\").template as<uint16_t>()"
               ,(char (*) [83])
                "failed: expected (1234u) == (subReader.get(\"uInt16Field\").template as<uint16_t>())"
               ,(uint *)&local_900,(unsigned_short *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_42.content.size_ = 0xc;
  name_42.content.ptr = "uInt32Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_42);
  uVar11 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar11 != 0x3628814) && (kj::_::Debug::minSeverity < 3)) {
    local_900.type = 0x3628814;
    name_43.content.size_ = 0xc;
    name_43.content.ptr = "uInt32Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_43);
    uVar11 = DynamicValue::Reader::AsImpl<unsigned_int,_(capnp::Kind)0>::apply((Reader *)&local_948)
    ;
    local_868.schema.elementType.baseType = (short)uVar11;
    local_868.schema.elementType.listDepth = (char)(uVar11 >> 0x10);
    local_868.schema.elementType.isImplicitParam = (bool)(char)(uVar11 >> 0x18);
    kj::_::Debug::log<char_const(&)[87],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16a,ERROR,
               "\"failed: expected \" \"(56789012u) == (subReader.get(\\\"uInt32Field\\\").template as<uint32_t>())\", 56789012u, subReader.get(\"uInt32Field\").template as<uint32_t>()"
               ,(char (*) [87])
                "failed: expected (56789012u) == (subReader.get(\"uInt32Field\").template as<uint32_t>())"
               ,(uint *)&local_900,(uint *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_44.content.size_ = 0xc;
  name_44.content.ptr = "uInt64Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_44);
  uVar15 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply((Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar15 != 0x4cc1921126f0ad2) && (kj::_::Debug::minSeverity < 3)) {
    local_900._0_8_ = (char *)0x4cc1921126f0ad2;
    name_45.content.size_ = 0xc;
    name_45.content.ptr = "uInt64Field";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_45);
    puVar14 = (uchar *)DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
    local_868.schema.elementType._0_8_ = puVar14;
    kj::_::Debug::log<char_const(&)[99],unsigned_long_long,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x16b,ERROR,
               "\"failed: expected \" \"(345678901234567890ull) == (subReader.get(\\\"uInt64Field\\\").template as<uint64_t>())\", 345678901234567890ull, subReader.get(\"uInt64Field\").template as<uint64_t>()"
               ,(char (*) [99])
                "failed: expected (345678901234567890ull) == (subReader.get(\"uInt64Field\").template as<uint64_t>())"
               ,(unsigned_long_long *)&local_900,(unsigned_long *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_46.content.size_ = 0xd;
  name_46.content.ptr = "float32Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_46);
  fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
  if ((fVar19 != -1.25e-10) || (NAN(fVar19))) {
    fVar20 = fVar19 + 1.25e-10;
    fVar24 = -fVar20;
    if (-fVar20 <= fVar20) {
      fVar24 = fVar20;
    }
    local_8b8._0_8_ = (double)fVar24;
    fVar24 = -fVar19;
    if (-fVar19 <= fVar19) {
      fVar24 = fVar19;
    }
    local_828._0_8_ = (double)(fVar24 + 1.25e-10) * 1e-05;
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (((double)local_828._0_8_ <= (double)local_8b8._0_8_) && (kj::_::Debug::minSeverity < 3)) {
      name_47.content.size_ = 0xd;
      name_47.content.ptr = "float32Field";
      DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_47);
      fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
      local_900.type = (Type)fVar19;
      local_868.schema.elementType.baseType = 0x705f;
      local_868.schema.elementType.listDepth = '\t';
      local_868.schema.elementType.isImplicitParam = true;
      kj::_::Debug::log<char_const(&)[107],float,float>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16c,ERROR,
                 "\"failed: expected \" \"::kj::_::floatAlmostEqual(subReader.get(\\\"float32Field\\\").template as<float>(), -1.25e-10f)\", subReader.get(\"float32Field\").template as<float>(), -1.25e-10f"
                 ,(char (*) [107])
                  "failed: expected ::kj::_::floatAlmostEqual(subReader.get(\"float32Field\").template as<float>(), -1.25e-10f)"
                 ,(float *)&local_900,(float *)&local_868);
      goto LAB_00246ae9;
    }
  }
  else {
LAB_00246ae9:
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_48.content.size_ = 0xd;
  name_48.content.ptr = "float64Field";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_48);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
  if ((dVar1 != 345.0) || (NAN(dVar1))) {
    dVar21 = dVar1 + -345.0;
    dVar3 = (double)((ulong)dVar21 ^ (ulong)DAT_002c6480);
    local_8b8._0_4_ = SUB84(dVar3,0);
    local_8b8._4_4_ = (undefined4)((ulong)dVar3 >> 0x20);
    if (dVar3 <= dVar21) {
      local_8b8._0_4_ = SUB84(dVar21,0);
      local_8b8._4_4_ = (undefined4)((ulong)dVar21 >> 0x20);
    }
    local_8b8._8_4_ = DAT_002c6480._8_4_;
    local_8b8._12_4_ = DAT_002c6480._12_4_;
    dVar3 = (double)((ulong)DAT_002c6480 ^ (ulong)dVar1);
    uVar22 = SUB84(dVar3,0);
    uVar23 = (undefined4)((ulong)dVar3 >> 0x20);
    uVar4 = DAT_002c6480._8_8_ ^ CONCAT44(extraout_XMM0_Dd_00,extraout_XMM0_Dc_00);
    if (dVar3 <= dVar1) {
      uVar22 = SUB84(dVar1,0);
      uVar23 = (undefined4)((ulong)dVar1 >> 0x20);
    }
    local_828._8_4_ = (int)uVar4;
    local_828._0_8_ = ((double)CONCAT44(uVar23,uVar22) + 345.0) * 1e-12;
    local_828._12_4_ = (int)(uVar4 >> 0x20);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (((double)local_828._0_8_ <= (double)local_8b8._0_8_) && (kj::_::Debug::minSeverity < 3)) {
      name_49.content.size_ = 0xd;
      name_49.content.ptr = "float64Field";
      DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_49);
      pcVar2 = (char *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
      local_900._0_8_ = pcVar2;
      local_868.schema.elementType.baseType = 0x159;
      local_868.schema.elementType.listDepth = '\0';
      local_868.schema.elementType.isImplicitParam = false;
      kj::_::Debug::log<char_const(&)[102],double,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16d,ERROR,
                 "\"failed: expected \" \"::kj::_::doubleAlmostEqual(subReader.get(\\\"float64Field\\\").template as<double>(), 345)\", subReader.get(\"float64Field\").template as<double>(), 345"
                 ,(char (*) [102])
                  "failed: expected ::kj::_::doubleAlmostEqual(subReader.get(\"float64Field\").template as<double>(), 345)"
                 ,(double *)&local_900,(int *)&local_868);
      goto LAB_00246c04;
    }
  }
  else {
LAB_00246c04:
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_50.content.size_ = 10;
  name_50.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_50);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  if (RVar25.super_StringPtr.content.size_ == 4) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"baz",3);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (iVar12 != 0) goto joined_r0x00246c7b;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
joined_r0x00246c7b:
    if (kj::_::Debug::minSeverity < 3) {
      name_51.content.size_ = 10;
      name_51.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_51);
      local_900._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
      kj::_::Debug::log<char_const(&)[77],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16e,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (subReader.get(\\\"textField\\\").template as<Text>())\", \"baz\", subReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [77])
                  "failed: expected (\"baz\") == (subReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [4])0x2c5c46,(Reader *)&local_900);
      DynamicValue::Reader::~Reader((Reader *)&local_948);
    }
  }
  name_52.content.size_ = 10;
  name_52.content.ptr = "dataField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_52);
  RVar26 = DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply((Reader *)&local_948);
  if (RVar26.super_ArrayPtr<const_unsigned_char>.size_ == 3) {
    if (*RVar26.super_ArrayPtr<const_unsigned_char>.ptr == 'q') {
      uVar4 = 0;
      do {
        uVar17 = uVar4;
        if (uVar17 == 2) break;
        uVar4 = uVar17 + 1;
      } while ("bazqux"[uVar17 + 4] == RVar26.super_ArrayPtr<const_unsigned_char>.ptr[uVar17 + 1]);
      bVar18 = 1 < uVar17;
    }
    else {
      bVar18 = false;
    }
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (!bVar18) goto LAB_00246d6c;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
LAB_00246d6c:
    if (kj::_::Debug::minSeverity < 3) {
      local_900.field_1.intValue = 3;
      local_900._0_8_ = "qux";
      name_53.content.size_ = 10;
      name_53.content.ptr = "dataField";
      DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_53);
      local_868.schema.elementType =
           (Type)DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply
                           ((Reader *)&local_948);
      kj::_::Debug::log<char_const(&)[83],capnp::Data::Reader,capnp::Data::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x16f,ERROR,
                 "\"failed: expected \" \"(data(\\\"qux\\\")) == (subReader.get(\\\"dataField\\\").template as<Data>())\", data(\"qux\"), subReader.get(\"dataField\").template as<Data>()"
                 ,(char (*) [83])
                  "failed: expected (data(\"qux\")) == (subReader.get(\"dataField\").template as<Data>())"
                 ,(Reader *)&local_900,(Reader *)&local_868);
      DynamicValue::Reader::~Reader((Reader *)&local_948);
    }
  }
  name_54.content.size_ = 0xc;
  name_54.content.ptr = "structField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_54);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_868,(Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  name_55.content.size_ = 10;
  name_55.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_868,name_55);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  if (RVar25.super_StringPtr.content.size_ == 7) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"nested",6);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (iVar12 != 0) goto joined_r0x00246ea3;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
joined_r0x00246ea3:
    if (kj::_::Debug::minSeverity < 3) {
      name_56.content.size_ = 10;
      name_56.content.ptr = "textField";
      DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_868,name_56);
      local_900._0_16_ =
           DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
      kj::_::Debug::log<char_const(&)[83],char_const(&)[7],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x172,ERROR,
                 "\"failed: expected \" \"(\\\"nested\\\") == (subSubReader.get(\\\"textField\\\").template as<Text>())\", \"nested\", subSubReader.get(\"textField\").template as<Text>()"
                 ,(char (*) [83])
                  "failed: expected (\"nested\") == (subSubReader.get(\"textField\").template as<Text>())"
                 ,(char (*) [7])0x2d3390,(Reader *)&local_900);
      DynamicValue::Reader::~Reader((Reader *)&local_948);
    }
  }
  name_57.content.size_ = 0xc;
  name_57.content.ptr = "structField";
  DynamicStruct::Reader::get(&local_900,(Reader *)&local_868,name_57);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
  name_58.content.size_ = 10;
  name_58.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_58);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xe) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"really nested",0xd);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    name_59.content.size_ = 0xc;
    name_59.content.ptr = "structField";
    DynamicStruct::Reader::get(&local_900,(Reader *)&local_868,name_59);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
    name_60.content.size_ = 10;
    name_60.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_60);
    local_7d8 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[139],char_const(&)[14],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x174,ERROR,
               "\"failed: expected \" \"(\\\"really nested\\\") == (subSubReader.get(\\\"structField\\\").template as<DynamicStruct>() .get(\\\"textField\\\").template as<Text>())\", \"really nested\", subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>()"
               ,(char (*) [139])
                "failed: expected (\"really nested\") == (subSubReader.get(\"structField\").template as<DynamicStruct>() .get(\"textField\").template as<Text>())"
               ,(char (*) [14])"really nested",(Reader *)&local_7d8);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  name_61.content.size_ = 10;
  name_61.content.ptr = "enumField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_61);
  DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&local_948);
  RVar27 = anon_unknown_129::name((DynamicEnum)in_stack_fffffffffffff6f0);
  if (RVar27.super_StringPtr.content.size_ == 4) {
    iVar12 = bcmp(RVar27.super_StringPtr.content.ptr,"baz",3);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (iVar12 != 0) goto joined_r0x002470dd;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
joined_r0x002470dd:
    if (kj::_::Debug::minSeverity < 3) {
      name_62.content.size_ = 10;
      name_62.content.ptr = "enumField";
      DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_62);
      DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&local_948);
      local_900._0_16_ = anon_unknown_129::name((DynamicEnum)in_stack_fffffffffffff6f0);
      kj::_::Debug::log<char_const(&)[90],char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                 ,0x176,ERROR,
                 "\"failed: expected \" \"(\\\"baz\\\") == (name(subReader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"baz\", name(subReader.get(\"enumField\").template as<DynamicEnum>())"
                 ,(char (*) [90])
                  "failed: expected (\"baz\") == (name(subReader.get(\"enumField\").template as<DynamicEnum>()))"
                 ,(char (*) [4])0x2c5c46,(Reader *)&local_900);
      DynamicValue::Reader::~Reader((Reader *)&local_948);
    }
  }
  name_63.content.size_ = 9;
  name_63.content.ptr = "voidList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_78,&local_8a0,name_63);
  expected._M_len = sVar16;
  expected._M_array = (iterator)0x3;
  checkList<capnp::Void,capnp::DynamicValue::Reader>((_ *)&local_78,(Reader *)&local_948,expected);
  DynamicValue::Reader::~Reader(&local_78);
  name_64.content.size_ = 9;
  name_64.content.ptr = "boolList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_c0,&local_8a0,name_64);
  local_948.exception._0_5_ = 0x101000100;
  expected_00._M_len = sVar16;
  expected_00._M_array = (iterator)0x5;
  checkList<bool,capnp::DynamicValue::Reader>((_ *)&local_c0,(Reader *)&local_948,expected_00);
  DynamicValue::Reader::~Reader(&local_c0);
  name_65.content.size_ = 9;
  name_65.content.ptr = "int8List";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_108,&local_8a0,name_65);
  local_948.exception._0_4_ = 0x7f80de0c;
  expected_01._M_len = sVar16;
  expected_01._M_array = (iterator)0x4;
  checkList<signed_char,capnp::DynamicValue::Reader>
            ((_ *)&local_108,(Reader *)&local_948,expected_01);
  DynamicValue::Reader::~Reader(&local_108);
  name_66.content.size_ = 10;
  name_66.content.ptr = "int16List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_150,&local_8a0,name_66);
  local_948.exception = (Exception *)0x7fff8000e9d204d2;
  expected_02._M_len = sVar16;
  expected_02._M_array = (iterator)0x4;
  checkList<short,capnp::DynamicValue::Reader>((_ *)&local_150,(Reader *)&local_948,expected_02);
  DynamicValue::Reader::~Reader(&local_150);
  name_67.content.size_ = 10;
  name_67.content.ptr = "int32List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_198,&local_8a0,name_67);
  local_948.exception = (Exception *)0xfaa0d34000bc614e;
  pcStack_940 = (char *)0x7fffffff80000000;
  expected_03._M_len = sVar16;
  expected_03._M_array = (iterator)0x4;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_198,(Reader *)&local_948,expected_03);
  DynamicValue::Reader::~Reader(&local_198);
  name_68.content.size_ = 10;
  name_68.content.ptr = "int64List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_1e0,&local_8a0,name_68);
  local_938 = (char *)0x8000000000000000;
  uStack_930 = (SegmentReader *)0x7fffffffffffffff;
  local_948.exception = (Exception *)0x7048860ddf79;
  pcStack_940 = (char *)0xfffd968afd13752e;
  expected_04._M_len = sVar16;
  expected_04._M_array = (iterator)0x4;
  checkList<long,capnp::DynamicValue::Reader>((_ *)&local_1e0,(Reader *)&local_948,expected_04);
  DynamicValue::Reader::~Reader(&local_1e0);
  name_69.content.size_ = 10;
  name_69.content.ptr = "uInt8List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_228,&local_8a0,name_69);
  local_948.exception._0_4_ = 0xff00220c;
  expected_05._M_len = sVar16;
  expected_05._M_array = (iterator)0x4;
  checkList<unsigned_char,capnp::DynamicValue::Reader>
            ((_ *)&local_228,(Reader *)&local_948,expected_05);
  DynamicValue::Reader::~Reader(&local_228);
  name_70.content.size_ = 0xb;
  name_70.content.ptr = "uInt16List";
  sVar16 = 0xb;
  DynamicStruct::Reader::get(&local_270,&local_8a0,name_70);
  local_948.exception = (Exception *)0xffff0000162e04d2;
  expected_06._M_len = sVar16;
  expected_06._M_array = (iterator)0x4;
  checkList<unsigned_short,capnp::DynamicValue::Reader>
            ((_ *)&local_270,(Reader *)&local_948,expected_06);
  DynamicValue::Reader::~Reader(&local_270);
  name_71.content.size_ = 0xb;
  name_71.content.ptr = "uInt32List";
  sVar16 = 0xb;
  DynamicStruct::Reader::get(&local_2b8,&local_8a0,name_71);
  local_948.exception = (Exception *)0x55f2cc000bc614e;
  pcStack_940 = (char *)0xffffffff00000000;
  expected_07._M_len = sVar16;
  expected_07._M_array = (iterator)0x4;
  checkList<unsigned_int,capnp::DynamicValue::Reader>
            ((_ *)&local_2b8,(Reader *)&local_948,expected_07);
  DynamicValue::Reader::~Reader(&local_2b8);
  name_72.content.size_ = 0xb;
  name_72.content.ptr = "uInt64List";
  sVar16 = 0xb;
  DynamicStruct::Reader::get(&local_300,&local_8a0,name_72);
  local_938 = (char *)0x0;
  uStack_930 = (SegmentReader *)0xffffffffffffffff;
  local_948.exception = (Exception *)0x7048860ddf79;
  pcStack_940 = (char *)0x2697502ec8ad2;
  expected_08._M_len = sVar16;
  expected_08._M_array = (iterator)0x4;
  checkList<unsigned_long,capnp::DynamicValue::Reader>
            ((_ *)&local_300,(Reader *)&local_948,expected_08);
  DynamicValue::Reader::~Reader(&local_300);
  name_73.content.size_ = 0xc;
  name_73.content.ptr = "float32List";
  sVar16 = 0xc;
  DynamicStruct::Reader::get(&local_348,&local_8a0,name_73);
  local_948.exception = (Exception *)0x4996b43800000000;
  pcStack_940 = (char *)0xfcf0bdc27cf0bdc2;
  local_938 = (char *)0x82081cea02081cea;
  expected_09._M_len = sVar16;
  expected_09._M_array = (iterator)0x6;
  checkList<float,capnp::DynamicValue::Reader>((_ *)&local_348,(Reader *)&local_948,expected_09);
  DynamicValue::Reader::~Reader(&local_348);
  name_74.content.size_ = 0xc;
  name_74.content.ptr = "float64List";
  sVar16 = 0xc;
  DynamicStruct::Reader::get(&local_390,&local_8a0,name_74);
  local_928 = (char *)0x66789e3750f791;
  uStack_920 = (byte *)0x8066789e3750f791;
  local_938 = (char *)0x7f76c8e5ca239029;
  uStack_930 = (SegmentReader *)0xff76c8e5ca239029;
  local_948.exception = (Exception *)0x0;
  pcStack_940 = (char *)0x42dc12218377de40;
  expected_10._M_len = sVar16;
  expected_10._M_array = (iterator)0x6;
  checkList<double,capnp::DynamicValue::Reader>((_ *)&local_390,(Reader *)&local_948,expected_10);
  DynamicValue::Reader::~Reader(&local_390);
  name_75.content.size_ = 9;
  name_75.content.ptr = "textList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_3d8,&local_8a0,name_75);
  local_948.exception = (Exception *)0x2cb62c;
  pcStack_940 = (char *)0x5;
  local_938 = "corge";
  uStack_930 = (SegmentReader *)0x6;
  local_928 = "grault";
  uStack_920 = (byte *)0x7;
  expected_11._M_len = sVar16;
  expected_11._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_3d8,(Reader *)&local_948,expected_11);
  DynamicValue::Reader::~Reader(&local_3d8);
  name_76.content.size_ = 9;
  name_76.content.ptr = "dataList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_420,&local_8a0,name_76);
  local_948.exception = (Exception *)0x2cf5ae;
  pcStack_940 = (char *)0x6;
  local_938 = anon_var_dwarf_8676b;
  uStack_930 = (SegmentReader *)0x5;
  local_928 = "fred";
  uStack_920 = (byte *)0x4;
  expected_12._M_len = sVar16;
  expected_12._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>
            ((_ *)&local_420,(Reader *)&local_948,expected_12);
  DynamicValue::Reader::~Reader(&local_420);
  name_77.content.size_ = 0xb;
  name_77.content.ptr = "structList";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_77);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_868,(Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (local_868.reader.elementCount != 3) {
    local_900.type = 3;
    local_810.ptr._0_4_ = local_868.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_948,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x189,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",&local_900.type,
               (uint *)&local_810);
    kj::_::Debug::Fault::fatal(&local_948);
  }
  DynamicList::Reader::operator[](&local_900,&local_868,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
  name_78.content.size_ = 10;
  name_78.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_78);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xf) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"x structlist 1",0xe);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Reader::operator[](&local_900,&local_868,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
    name_79.content.size_ = 10;
    name_79.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_79);
    local_7d8 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18a,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 1",(Reader *)&local_7d8);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  DynamicList::Reader::operator[](&local_900,&local_868,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
  name_80.content.size_ = 10;
  name_80.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_80);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xf) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"x structlist 2",0xe);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Reader::operator[](&local_900,&local_868,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
    name_81.content.size_ = 10;
    name_81.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_81);
    local_7d8 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18b,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 2",(Reader *)&local_7d8);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  DynamicList::Reader::operator[](&local_900,&local_868,2);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
  name_82.content.size_ = 10;
  name_82.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_82);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xf) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"x structlist 3",0xe);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Reader::operator[](&local_900,&local_868,2);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_810,&local_900);
    name_83.content.size_ = 10;
    name_83.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&local_810,name_83);
    local_7d8 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[121],char_const(&)[15],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x18c,ERROR,
               "\"failed: expected \" \"(\\\"x structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"x structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [121])
                "failed: expected (\"x structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [15])"x structlist 3",(Reader *)&local_7d8);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  name_84.content.size_ = 9;
  name_84.content.ptr = "enumList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_468,&local_8a0,name_84);
  local_938 = "grault";
  local_948.exception = (Exception *)0x2cb625;
  pcStack_940 = (char *)((long)"\"failed: expected \" \"(\\\"foo\\\") == (bar)\", \"foo\", bar" +
                        0x31);
  expected_13._M_len = sVar16;
  expected_13._M_array = (iterator)0x3;
  checkEnumList<capnp::DynamicValue::Reader>
            ((anon_unknown_129 *)&local_468,(Reader *)&local_948,expected_13);
  DynamicValue::Reader::~Reader(&local_468);
  name_85.content.size_ = 10;
  name_85.content.ptr = "enumField";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_85);
  DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&local_948);
  RVar27 = anon_unknown_129::name((DynamicEnum)in_stack_fffffffffffff6f0);
  if (RVar27.super_StringPtr.content.size_ == 6) {
    iVar12 = bcmp(RVar27.super_StringPtr.content.ptr,"corge",5);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    if (iVar12 == 0) goto LAB_00247b6f;
  }
  else {
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  if (kj::_::Debug::minSeverity < 3) {
    name_86.content.size_ = 10;
    name_86.content.ptr = "enumField";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_86);
    DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&local_948);
    local_900._0_16_ = anon_unknown_129::name((DynamicEnum)in_stack_fffffffffffff6f0);
    kj::_::Debug::log<char_const(&)[89],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,400,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (name(reader.get(\\\"enumField\\\").template as<DynamicEnum>()))\", \"corge\", name(reader.get(\"enumField\").template as<DynamicEnum>())"
               ,(char (*) [89])
                "failed: expected (\"corge\") == (name(reader.get(\"enumField\").template as<DynamicEnum>()))"
               ,(char (*) [6])"corge",(Reader *)&local_900);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
LAB_00247b6f:
  name_87.content.size_ = 9;
  name_87.content.ptr = "voidList";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_87);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_900,(Reader *)&local_948);
  uVar22 = local_900.field_1._32_4_;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((uVar22 != 6) && (kj::_::Debug::minSeverity < 3)) {
    local_868.schema.elementType.baseType = UINT8;
    local_868.schema.elementType.listDepth = '\0';
    local_868.schema.elementType.isImplicitParam = false;
    name_88.content.size_ = 9;
    name_88.content.ptr = "voidList";
    DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_88);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_900,(Reader *)&local_948);
    local_8a0.schema.super_Schema.raw._0_4_ = local_900.field_1._32_4_;
    kj::_::Debug::log<char_const(&)[84],unsigned_int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x192,ERROR,
               "\"failed: expected \" \"(6u) == (reader.get(\\\"voidList\\\").template as<DynamicList>().size())\", 6u, reader.get(\"voidList\").template as<DynamicList>().size()"
               ,(char (*) [84])
                "failed: expected (6u) == (reader.get(\"voidList\").template as<DynamicList>().size())"
               ,(uint *)&local_868,(uint *)&local_8a0);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  name_89.content.size_ = 9;
  name_89.content.ptr = "boolList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_4b0,(Reader *)&stack0x00000008,name_89);
  local_948.exception._0_4_ = 0x1000001;
  expected_14._M_len = sVar16;
  expected_14._M_array = (iterator)0x4;
  checkList<bool,capnp::DynamicValue::Reader>((_ *)&local_4b0,(Reader *)&local_948,expected_14);
  DynamicValue::Reader::~Reader(&local_4b0);
  name_90.content.size_ = 9;
  name_90.content.ptr = "int8List";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_4f8,(Reader *)&stack0x00000008,name_90);
  local_948.exception._0_2_ = 0x916f;
  expected_15._M_len = sVar16;
  expected_15._M_array = (iterator)0x2;
  checkList<signed_char,capnp::DynamicValue::Reader>
            ((_ *)&local_4f8,(Reader *)&local_948,expected_15);
  DynamicValue::Reader::~Reader(&local_4f8);
  name_91.content.size_ = 10;
  name_91.content.ptr = "int16List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_540,(Reader *)&stack0x00000008,name_91);
  local_948.exception._0_4_ = 0xd4992b67;
  expected_16._M_len = sVar16;
  expected_16._M_array = (iterator)0x2;
  checkList<short,capnp::DynamicValue::Reader>((_ *)&local_540,(Reader *)&local_948,expected_16);
  DynamicValue::Reader::~Reader(&local_540);
  name_92.content.size_ = 10;
  name_92.content.ptr = "int32List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_588,(Reader *)&stack0x00000008,name_92);
  local_948.exception = (Exception *)0xf9609439069f6bc7;
  expected_17._M_len = sVar16;
  expected_17._M_array = (iterator)0x2;
  checkList<int,capnp::DynamicValue::Reader>((_ *)&local_588,(Reader *)&local_948,expected_17);
  DynamicValue::Reader::~Reader(&local_588);
  name_93.content.size_ = 10;
  name_93.content.ptr = "int64List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_5d0,(Reader *)&stack0x00000008,name_93);
  local_948.exception = (Exception *)0xf6b75ab2bc471c7;
  pcStack_940 = (char *)0xf0948a54d43b8e39;
  expected_18._M_len = sVar16;
  expected_18._M_array = (iterator)0x2;
  checkList<long,capnp::DynamicValue::Reader>((_ *)&local_5d0,(Reader *)&local_948,expected_18);
  DynamicValue::Reader::~Reader(&local_5d0);
  name_94.content.size_ = 10;
  name_94.content.ptr = "uInt8List";
  sVar16 = 10;
  DynamicStruct::Reader::get(&local_618,(Reader *)&stack0x00000008,name_94);
  local_948.exception._0_2_ = 0xde6f;
  expected_19._M_len = sVar16;
  expected_19._M_array = (iterator)0x2;
  checkList<unsigned_char,capnp::DynamicValue::Reader>
            ((_ *)&local_618,(Reader *)&local_948,expected_19);
  DynamicValue::Reader::~Reader(&local_618);
  name_95.content.size_ = 0xb;
  name_95.content.ptr = "uInt16List";
  sVar16 = 0xb;
  DynamicStruct::Reader::get(&local_660,(Reader *)&stack0x00000008,name_95);
  local_948.exception._0_4_ = 0xad9c8235;
  expected_20._M_len = sVar16;
  expected_20._M_array = (iterator)0x2;
  checkList<unsigned_short,capnp::DynamicValue::Reader>
            ((_ *)&local_660,(Reader *)&local_948,expected_20);
  DynamicValue::Reader::~Reader(&local_660);
  name_96.content.size_ = 0xb;
  name_96.content.ptr = "uInt32List";
  sVar16 = 0xb;
  DynamicStruct::Reader::get(&local_6a8,(Reader *)&stack0x00000008,name_96);
  local_948.exception._0_4_ = 0xc6aea155;
  expected_21._M_len = sVar16;
  expected_21._M_array = (iterator)0x1;
  checkList<unsigned_int,capnp::DynamicValue::Reader>
            ((_ *)&local_6a8,(Reader *)&local_948,expected_21);
  DynamicValue::Reader::~Reader(&local_6a8);
  name_97.content.size_ = 0xb;
  name_97.content.ptr = "uInt64List";
  sVar16 = 0xb;
  DynamicStruct::Reader::get(&local_6f0,(Reader *)&stack0x00000008,name_97);
  local_948.exception = (Exception *)0x9a3298afb5ac71c7;
  expected_22._M_len = sVar16;
  expected_22._M_array = (iterator)0x1;
  checkList<unsigned_long,capnp::DynamicValue::Reader>
            ((_ *)&local_6f0,(Reader *)&local_948,expected_22);
  DynamicValue::Reader::~Reader(&local_6f0);
  name_98.content.size_ = 0xc;
  name_98.content.ptr = "float32List";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_98);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_900,(Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (local_900.field_1._32_4_ != 4) {
    local_868.schema.elementType.baseType = INT32;
    local_868.schema.elementType.listDepth = '\0';
    local_868.schema.elementType.isImplicitParam = false;
    local_8a0.schema.super_Schema.raw._0_4_ = local_900.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_948,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x19e,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
               (uint *)&local_868,(uint *)&local_8a0);
    kj::_::Debug::Fault::fatal(&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,0);
  fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_4_ = fVar19;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((((float)local_8b8._0_4_ != 5555.5) || (NAN((float)local_8b8._0_4_))) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_868.schema.elementType.baseType = 0x9c00;
    local_868.schema.elementType.listDepth = 0xad;
    local_868.schema.elementType.isImplicitParam = true;
    DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,0);
    fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_8a0.schema.super_Schema.raw._0_4_ = fVar19;
    kj::_::Debug::log<char_const(&)[67],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x19f,ERROR,
               "\"failed: expected \" \"(5555.5f) == (listReader[0].template as<float>())\", 5555.5f, listReader[0].template as<float>()"
               ,(char (*) [67])"failed: expected (5555.5f) == (listReader[0].template as<float>())",
               (float *)&local_868,(float *)&local_8a0);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,1);
  fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_4_ = fVar19;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (((float)local_8b8._0_4_ < INFINITY) && (kj::_::Debug::minSeverity < 3)) {
    local_868.schema.elementType.baseType = VOID;
    local_868.schema.elementType.listDepth = 0x80;
    local_868.schema.elementType.isImplicitParam = true;
    DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,1);
    fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_8a0.schema.super_Schema.raw._0_4_ = fVar19;
    kj::_::Debug::log<char_const(&)[69],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a0,ERROR,
               "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<float>())\", kj::inf(), listReader[1].template as<float>()"
               ,(char (*) [69])
                "failed: expected (kj::inf()) == (listReader[1].template as<float>())",
               (float *)&local_868,(float *)&local_8a0);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,2);
  fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_4_ = fVar19;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((-INFINITY < (float)local_8b8._0_4_) && (kj::_::Debug::minSeverity < 3)) {
    local_868.schema.elementType.baseType = VOID;
    local_868.schema.elementType.listDepth = 0x80;
    local_868.schema.elementType.isImplicitParam = true;
    DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,2);
    fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
    local_8a0.schema.super_Schema.raw._0_4_ = fVar19;
    kj::_::Debug::log<char_const(&)[70],float,float>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a1,ERROR,
               "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<float>())\", -kj::inf(), listReader[2].template as<float>()"
               ,(char (*) [70])
                "failed: expected (-kj::inf()) == (listReader[2].template as<float>())",
               (float *)&local_868,(float *)&local_8a0);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,3);
  fVar19 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_4_ = fVar19;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((!NAN((float)local_8b8._0_4_)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[59]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a2,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<float>())\"",
               (char (*) [59])"failed: expected isNaN(listReader[3].template as<float>())");
  }
  name_99.content.size_ = 0xc;
  name_99.content.ptr = "float64List";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_99);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            ((ReaderFor<DynamicList> *)&local_900,(Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (local_900.field_1._32_4_ != 4) {
    local_868.schema.elementType.baseType = INT32;
    local_868.schema.elementType.listDepth = '\0';
    local_868.schema.elementType.isImplicitParam = false;
    local_8a0.schema.super_Schema.raw._0_4_ = local_900.field_1._32_4_;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_948,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a6,FAILED,"(4u) == (listReader.size())","4u, listReader.size()",
               (uint *)&local_868,(uint *)&local_8a0);
    kj::_::Debug::Fault::fatal(&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,0);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_8_ = dVar1;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((((double)local_8b8._0_8_ != 7777.75) || (NAN((double)local_8b8._0_8_))) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_868.schema.elementType._0_8_ = (uchar *)0x40be61c000000000;
    DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,0);
    local_8a0.schema.super_Schema.raw =
         (Schema)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[68],double,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a7,ERROR,
               "\"failed: expected \" \"(7777.75) == (listReader[0].template as<double>())\", 7777.75, listReader[0].template as<double>()"
               ,(char (*) [68])"failed: expected (7777.75) == (listReader[0].template as<double>())"
               ,(double *)&local_868,(double *)&local_8a0);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,1);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_8_ = dVar1;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (((double)local_8b8._0_8_ < INFINITY) && (kj::_::Debug::minSeverity < 3)) {
    local_8a0.schema.super_Schema.raw._0_4_ = 0x7f800000;
    DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,1);
    puVar14 = (uchar *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
    local_868.schema.elementType._0_8_ = puVar14;
    kj::_::Debug::log<char_const(&)[70],float,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a8,ERROR,
               "\"failed: expected \" \"(kj::inf()) == (listReader[1].template as<double>())\", kj::inf(), listReader[1].template as<double>()"
               ,(char (*) [70])
                "failed: expected (kj::inf()) == (listReader[1].template as<double>())",
               (float *)&local_8a0,(double *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,2);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_8_ = dVar1;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((-INFINITY < (double)local_8b8._0_8_) && (kj::_::Debug::minSeverity < 3)) {
    local_8a0.schema.super_Schema.raw._0_4_ = 0xff800000;
    DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,2);
    puVar14 = (uchar *)DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply
                                 ((Reader *)&local_948);
    local_868.schema.elementType._0_8_ = puVar14;
    kj::_::Debug::log<char_const(&)[71],float,double>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1a9,ERROR,
               "\"failed: expected \" \"(-kj::inf()) == (listReader[2].template as<double>())\", -kj::inf(), listReader[2].template as<double>()"
               ,(char (*) [71])
                "failed: expected (-kj::inf()) == (listReader[2].template as<double>())",
               (float *)&local_8a0,(double *)&local_868);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
  }
  DynamicList::Reader::operator[]((Reader *)&local_948,(Reader *)&local_900,3);
  dVar1 = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply((Reader *)&local_948);
  local_8b8._0_8_ = dVar1;
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if ((!NAN((double)local_8b8._0_8_)) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1aa,ERROR,"\"failed: expected \" \"isNaN(listReader[3].template as<double>())\"",
               (char (*) [60])"failed: expected isNaN(listReader[3].template as<double>())");
  }
  name_x00100.content.size_ = 9;
  name_x00100.content.ptr = "textList";
  DynamicStruct::Reader::get(&local_738,(Reader *)&stack0x00000008,name_x00100);
  local_948.exception = (Exception *)0x2cb7e3;
  pcStack_940 = (char *)0x6;
  local_938 = "xyzzy";
  uStack_930 = (SegmentReader *)0x6;
  local_928 = "thud";
  uStack_920 = (byte *)0x5;
  expected_23._M_len = (size_type)"xyzzy";
  expected_23._M_array = (iterator)0x3;
  checkList<capnp::Text,capnp::DynamicValue::Reader>
            ((_ *)&local_738,(Reader *)&local_948,expected_23);
  DynamicValue::Reader::~Reader(&local_738);
  name_x00101.content.size_ = 9;
  name_x00101.content.ptr = "dataList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_780,(Reader *)&stack0x00000008,name_x00101);
  local_948.exception = (Exception *)0x2d3b36;
  pcStack_940 = (char *)0x4;
  local_938 = anon_var_dwarf_885a4;
  uStack_930 = (SegmentReader *)0x9;
  local_928 = "rfc3092";
  uStack_920 = (byte *)0x7;
  expected_24._M_len = sVar16;
  expected_24._M_array = (iterator)0x3;
  checkList<capnp::Data,capnp::DynamicValue::Reader>
            ((_ *)&local_780,(Reader *)&local_948,expected_24);
  DynamicValue::Reader::~Reader(&local_780);
  name_x00102.content.size_ = 0xb;
  name_x00102.content.ptr = "structList";
  DynamicStruct::Reader::get((Reader *)&local_948,(Reader *)&stack0x00000008,name_x00102);
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
            (&local_868,(Reader *)&local_948);
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  if (local_868.reader.elementCount != 3) {
    local_900.type = 3;
    local_8a0.schema.super_Schema.raw._0_4_ = local_868.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_int,unsigned_int>
              (&local_948,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1b0,FAILED,"(3u) == (listReader.size())","3u, listReader.size()",
               (uint *)&local_900,(uint *)&local_8a0);
    kj::_::Debug::Fault::fatal(&local_948);
  }
  DynamicList::Reader::operator[](&local_900,&local_868,0);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_8a0,&local_900);
  name_x00103.content.size_ = 10;
  name_x00103.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_x00103);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xd) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"structlist 1",0xc);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Reader::operator[](&local_900,&local_868,0);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_8a0,&local_900)
    ;
    name_x00104.content.size_ = 10;
    name_x00104.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_x00104);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1b1,ERROR,
               "\"failed: expected \" \"(\\\"structlist 1\\\") == (listReader[0].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 1\", listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [119])
                "failed: expected (\"structlist 1\") == (listReader[0].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [13])0x2d356c,(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  DynamicList::Reader::operator[](&local_900,&local_868,1);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_8a0,&local_900);
  name_x00105.content.size_ = 10;
  name_x00105.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_x00105);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xd) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"structlist 2",0xc);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Reader::operator[](&local_900,&local_868,1);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_8a0,&local_900)
    ;
    name_x00106.content.size_ = 10;
    name_x00106.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_x00106);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1b2,ERROR,
               "\"failed: expected \" \"(\\\"structlist 2\\\") == (listReader[1].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 2\", listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [119])
                "failed: expected (\"structlist 2\") == (listReader[1].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [13])0x2c5177,(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  DynamicList::Reader::operator[](&local_900,&local_868,2);
  DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_8a0,&local_900);
  name_x00107.content.size_ = 10;
  name_x00107.content.ptr = "textField";
  DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_x00107);
  RVar25 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply((Reader *)&local_948);
  bVar18 = true;
  if (RVar25.super_StringPtr.content.size_ == 0xd) {
    iVar12 = bcmp(RVar25.super_StringPtr.content.ptr,"structlist 3",0xc);
    bVar18 = iVar12 != 0;
  }
  DynamicValue::Reader::~Reader((Reader *)&local_948);
  DynamicValue::Reader::~Reader(&local_900);
  if ((bool)(bVar18 & kj::_::Debug::minSeverity < 3)) {
    DynamicList::Reader::operator[](&local_900,&local_868,2);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_8a0,&local_900)
    ;
    name_x00108.content.size_ = 10;
    name_x00108.content.ptr = "textField";
    DynamicStruct::Reader::get((Reader *)&local_948,&local_8a0,name_x00108);
    local_810 = (ArrayPtr<const_char>)
                DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply
                          ((Reader *)&local_948);
    kj::_::Debug::log<char_const(&)[119],char_const(&)[13],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x1b3,ERROR,
               "\"failed: expected \" \"(\\\"structlist 3\\\") == (listReader[2].template as<DynamicStruct>().get(\\\"textField\\\").template as<Text>())\", \"structlist 3\", listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>()"
               ,(char (*) [119])
                "failed: expected (\"structlist 3\") == (listReader[2].template as<DynamicStruct>().get(\"textField\").template as<Text>())"
               ,(char (*) [13])0x2d3710,(Reader *)&local_810);
    DynamicValue::Reader::~Reader((Reader *)&local_948);
    DynamicValue::Reader::~Reader(&local_900);
  }
  name_x00109.content.size_ = 9;
  name_x00109.content.ptr = "enumList";
  sVar16 = 9;
  DynamicStruct::Reader::get(&local_7c8,(Reader *)&stack0x00000008,name_x00109);
  local_948.exception = (Exception *)0x2be152;
  pcStack_940 = "garply";
  expected_25._M_len = sVar16;
  expected_25._M_array = (iterator)0x2;
  checkEnumList<capnp::DynamicValue::Reader>
            ((anon_unknown_129 *)&local_7c8,(Reader *)&local_948,expected_25);
  DynamicValue::Reader::~Reader(&local_7c8);
  return;
}

Assistant:

void dynamicCheckTestMessage(Reader reader) {
  EXPECT_EQ(VOID, reader.get("voidField").as<Void>());
  EXPECT_EQ(true, reader.get("boolField").as<bool>());
  EXPECT_EQ(-123, reader.get("int8Field").as<int8_t>());
  EXPECT_EQ(-12345, reader.get("int16Field").as<int16_t>());
  EXPECT_EQ(-12345678, reader.get("int32Field").as<int32_t>());
  EXPECT_EQ(-123456789012345ll, reader.get("int64Field").as<int64_t>());
  EXPECT_EQ(234u, reader.get("uInt8Field").as<uint8_t>());
  EXPECT_EQ(45678u, reader.get("uInt16Field").as<uint16_t>());
  EXPECT_EQ(3456789012u, reader.get("uInt32Field").as<uint32_t>());
  EXPECT_EQ(12345678901234567890ull, reader.get("uInt64Field").as<uint64_t>());
  EXPECT_FLOAT_EQ(1234.5f, reader.get("float32Field").as<float>());
  EXPECT_DOUBLE_EQ(-123e45, reader.get("float64Field").as<double>());
  EXPECT_EQ("foo", reader.get("textField").as<Text>());
  EXPECT_EQ(data("bar"), reader.get("dataField").as<Data>());
  {
    auto subReader = reader.get("structField").as<DynamicStruct>();
    EXPECT_EQ(VOID, subReader.get("voidField").as<Void>());
    EXPECT_EQ(true, subReader.get("boolField").as<bool>());
    EXPECT_EQ(-12, subReader.get("int8Field").as<int8_t>());
    EXPECT_EQ(3456, subReader.get("int16Field").as<int16_t>());
    EXPECT_EQ(-78901234, subReader.get("int32Field").as<int32_t>());
    EXPECT_EQ(56789012345678ll, subReader.get("int64Field").as<int64_t>());
    EXPECT_EQ(90u, subReader.get("uInt8Field").as<uint8_t>());
    EXPECT_EQ(1234u, subReader.get("uInt16Field").as<uint16_t>());
    EXPECT_EQ(56789012u, subReader.get("uInt32Field").as<uint32_t>());
    EXPECT_EQ(345678901234567890ull, subReader.get("uInt64Field").as<uint64_t>());
    EXPECT_FLOAT_EQ(-1.25e-10f, subReader.get("float32Field").as<float>());
    EXPECT_DOUBLE_EQ(345, subReader.get("float64Field").as<double>());
    EXPECT_EQ("baz", subReader.get("textField").as<Text>());
    EXPECT_EQ(data("qux"), subReader.get("dataField").as<Data>());
    {
      auto subSubReader = subReader.get("structField").as<DynamicStruct>();
      EXPECT_EQ("nested", subSubReader.get("textField").as<Text>());
      EXPECT_EQ("really nested", subSubReader.get("structField").as<DynamicStruct>()
                                             .get("textField").as<Text>());
    }
    EXPECT_EQ("baz", name(subReader.get("enumField").as<DynamicEnum>()));

    checkList<Void>(subReader.get("voidList"), {VOID, VOID, VOID});
    checkList<bool>(subReader.get("boolList"), {false, true, false, true, true});
    checkList<int8_t>(subReader.get("int8List"), {12, -34, -0x80, 0x7f});
    checkList<int16_t>(subReader.get("int16List"), {1234, -5678, -0x8000, 0x7fff});
    // gcc warns on -0x800... and the only work-around I could find was to do -0x7ff...-1.
    checkList<int32_t>(subReader.get("int32List"), {12345678, -90123456, -0x7fffffff-1, 0x7fffffff});
    checkList<int64_t>(subReader.get("int64List"), {123456789012345ll, -678901234567890ll, -0x7fffffffffffffffll-1, 0x7fffffffffffffffll});
    checkList<uint8_t>(subReader.get("uInt8List"), {12u, 34u, 0u, 0xffu});
    checkList<uint16_t>(subReader.get("uInt16List"), {1234u, 5678u, 0u, 0xffffu});
    checkList<uint32_t>(subReader.get("uInt32List"), {12345678u, 90123456u, 0u, 0xffffffffu});
    checkList<uint64_t>(subReader.get("uInt64List"), {123456789012345ull, 678901234567890ull, 0ull, 0xffffffffffffffffull});
    checkList<float>(subReader.get("float32List"), {0.0f, 1234567.0f, 1e37f, -1e37f, 1e-37f, -1e-37f});
    checkList<double>(subReader.get("float64List"), {0.0, 123456789012345.0, 1e306, -1e306, 1e-306, -1e-306});
    checkList<Text>(subReader.get("textList"), {"quux", "corge", "grault"});
    checkList<Data>(subReader.get("dataList"), {data("garply"), data("waldo"), data("fred")});
    {
      auto listReader = subReader.get("structList").as<DynamicList>();
      ASSERT_EQ(3u, listReader.size());
      EXPECT_EQ("x structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
      EXPECT_EQ("x structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
    }
    checkEnumList(subReader.get("enumList"), {"qux", "bar", "grault"});
  }
  EXPECT_EQ("corge", name(reader.get("enumField").as<DynamicEnum>()));

  EXPECT_EQ(6u, reader.get("voidList").as<DynamicList>().size());
  checkList<bool>(reader.get("boolList"), {true, false, false, true});
  checkList<int8_t>(reader.get("int8List"), {111, -111});
  checkList<int16_t>(reader.get("int16List"), {11111, -11111});
  checkList<int32_t>(reader.get("int32List"), {111111111, -111111111});
  checkList<int64_t>(reader.get("int64List"), {1111111111111111111ll, -1111111111111111111ll});
  checkList<uint8_t>(reader.get("uInt8List"), {111u, 222u});
  checkList<uint16_t>(reader.get("uInt16List"), {33333u, 44444u});
  checkList<uint32_t>(reader.get("uInt32List"), {3333333333u});
  checkList<uint64_t>(reader.get("uInt64List"), {11111111111111111111ull});
  {
    auto listReader = reader.get("float32List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(5555.5f, listReader[0].as<float>());
    EXPECT_EQ(kj::inf(), listReader[1].as<float>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<float>());
    EXPECT_TRUE(isNaN(listReader[3].as<float>()));
  }
  {
    auto listReader = reader.get("float64List").as<DynamicList>();
    ASSERT_EQ(4u, listReader.size());
    EXPECT_EQ(7777.75, listReader[0].as<double>());
    EXPECT_EQ(kj::inf(), listReader[1].as<double>());
    EXPECT_EQ(-kj::inf(), listReader[2].as<double>());
    EXPECT_TRUE(isNaN(listReader[3].as<double>()));
  }
  checkList<Text>(reader.get("textList"), {"plugh", "xyzzy", "thud"});
  checkList<Data>(reader.get("dataList"), {data("oops"), data("exhausted"), data("rfc3092")});
  {
    auto listReader = reader.get("structList").as<DynamicList>();
    ASSERT_EQ(3u, listReader.size());
    EXPECT_EQ("structlist 1", listReader[0].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 2", listReader[1].as<DynamicStruct>().get("textField").as<Text>());
    EXPECT_EQ("structlist 3", listReader[2].as<DynamicStruct>().get("textField").as<Text>());
  }
  checkEnumList(reader.get("enumList"), {"foo", "garply"});
}